

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Type::addObjectMember(Type *this,string_view memberName,Type *memberType)

{
  Object *pOVar1;
  int iVar2;
  string_view s;
  MemberNameAndType local_68;
  Type *local_38;
  char *pcStack_30;
  Type *local_28;
  Type *memberType_local;
  Type *this_local;
  string_view memberName_local;
  
  pcStack_30 = memberName._M_str;
  local_38 = (Type *)memberName._M_len;
  local_28 = memberType;
  memberType_local = this;
  this_local = local_38;
  memberName_local._M_len = (size_t)pcStack_30;
  iVar2 = getObjectMemberIndex(this,memberName);
  check(SUB41((uint)iVar2 >> 0x1f,0),"This object already contains a member with the given name");
  pOVar1 = (this->content).object;
  s._M_str = (char *)this;
  s._M_len = memberName_local._M_len;
  local_68.name =
       anon_unknown_15::allocateString((anon_unknown_15 *)this->allocator,(Allocator *)this_local,s)
  ;
  Type(&local_68.type,memberType);
  AllocatedVector<choc::value::MemberNameAndType>::push_back(&pOVar1->members,&local_68);
  MemberNameAndType::~MemberNameAndType(&local_68);
  return;
}

Assistant:

inline void Type::addObjectMember (std::string_view memberName, Type memberType)
{
    check (getObjectMemberIndex (memberName) < 0, "This object already contains a member with the given name");
    content.object->members.push_back ({ allocateString (allocator, memberName), std::move (memberType) });
}